

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

opj_bool pi_create_encode(opj_pi_iterator_t *pi,opj_cp_t *cp,int tileno,int pino,int tpnum,int tppos
                         ,J2K_T2_MODE t2_mode,int cur_totnum_tp)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar2;
  int in_stack_00000008;
  opj_poc_t *tcp;
  opj_tcp_t *tcps;
  int resetX;
  int incr_top;
  int i;
  char prog [4];
  int local_30;
  char local_2c [4];
  int local_28;
  int local_24;
  int local_20;
  int *local_18;
  long local_10;
  
  bVar2 = true;
  lVar1 = *(long *)(in_RSI + 0x20) + (long)in_EDX * 0x15e8 + 0x1ac + (long)in_ECX * 0x94;
  *(undefined4 *)(in_RDI + 0x30 + (long)in_ECX * 0xf8) = 1;
  *(undefined4 *)(in_RDI + 0x58 + (long)in_ECX * 0xf8) = *(undefined4 *)(lVar1 + 0x24);
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  switch(*(undefined4 *)(lVar1 + 0x24)) {
  case 0:
    strncpy(local_2c,"LRCP",4);
    break;
  case 1:
    strncpy(local_2c,"RLCP",4);
    break;
  case 2:
    strncpy(local_2c,"RPCL",4);
    break;
  case 3:
    strncpy(local_2c,"PCRL",4);
    break;
  case 4:
    strncpy(local_2c,"CPRL",4);
    break;
  case 0xffffffff:
    return 1;
  }
  if (((char)local_18[4] == '\0') ||
     (((*local_18 != 0 || (in_stack_00000008 != 1)) && (*local_18 == 0)))) {
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x34) = *(undefined4 *)(lVar1 + 0x48);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x40) = *(undefined4 *)(lVar1 + 0x58);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x38) = *(undefined4 *)(lVar1 + 0x4c);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x44) = *(undefined4 *)(lVar1 + 0x5c);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x48) = *(undefined4 *)(lVar1 + 0x44);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x3c) = *(undefined4 *)(lVar1 + 0x54);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x4c) = *(undefined4 *)(lVar1 + 0x50);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x50) = *(undefined4 *)(lVar1 + 0x60);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x68) = *(undefined4 *)(lVar1 + 100);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x70) = *(undefined4 *)(lVar1 + 0x6c);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x6c) = *(undefined4 *)(lVar1 + 0x68);
    *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x74) = *(undefined4 *)(lVar1 + 0x70);
  }
  else if (local_24 < (int)tcp) {
    for (local_30 = 3; -1 < local_30; local_30 = local_30 + -1) {
      switch(local_2c[local_30]) {
      case 'C':
        if (local_28 < local_30) {
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x38) = *(undefined4 *)(lVar1 + 0x4c);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x44) = *(undefined4 *)(lVar1 + 0x5c);
        }
        else if (local_24 == 0) {
          *(undefined4 *)(lVar1 + 0x84) = *(undefined4 *)(lVar1 + 0x4c);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x38) = *(undefined4 *)(lVar1 + 0x84);
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x44) = *(int *)(lVar1 + 0x84) + 1;
          *(int *)(lVar1 + 0x84) = *(int *)(lVar1 + 0x84) + 1;
        }
        else if (bVar2) {
          bVar2 = *(int *)(lVar1 + 0x84) != *(int *)(lVar1 + 0x5c);
          if (bVar2) {
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x38) = *(undefined4 *)(lVar1 + 0x84)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x44) = *(int *)(lVar1 + 0x84) + 1;
            *(int *)(lVar1 + 0x84) = *(int *)(lVar1 + 0x84) + 1;
          }
          else {
            *(undefined4 *)(lVar1 + 0x84) = *(undefined4 *)(lVar1 + 0x4c);
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x38) = *(undefined4 *)(lVar1 + 0x84)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x44) = *(int *)(lVar1 + 0x84) + 1;
            *(int *)(lVar1 + 0x84) = *(int *)(lVar1 + 0x84) + 1;
          }
          bVar2 = !bVar2;
        }
        else {
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x38) = *(int *)(lVar1 + 0x84) + -1;
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x44) = *(undefined4 *)(lVar1 + 0x84);
        }
        break;
      case 'L':
        if (local_28 < local_30) {
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x48) = *(undefined4 *)(lVar1 + 0x44);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x3c) = *(undefined4 *)(lVar1 + 0x54);
        }
        else if (local_24 == 0) {
          *(undefined4 *)(lVar1 + 0x7c) = *(undefined4 *)(lVar1 + 0x44);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x48) = *(undefined4 *)(lVar1 + 0x7c);
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x3c) = *(int *)(lVar1 + 0x7c) + 1;
          *(int *)(lVar1 + 0x7c) = *(int *)(lVar1 + 0x7c) + 1;
        }
        else if (bVar2) {
          bVar2 = *(int *)(lVar1 + 0x7c) != *(int *)(lVar1 + 0x54);
          if (bVar2) {
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x48) = *(undefined4 *)(lVar1 + 0x7c)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x3c) = *(int *)(lVar1 + 0x7c) + 1;
            *(int *)(lVar1 + 0x7c) = *(int *)(lVar1 + 0x7c) + 1;
          }
          else {
            *(undefined4 *)(lVar1 + 0x7c) = *(undefined4 *)(lVar1 + 0x44);
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x48) = *(undefined4 *)(lVar1 + 0x7c)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x3c) = *(int *)(lVar1 + 0x7c) + 1;
            *(int *)(lVar1 + 0x7c) = *(int *)(lVar1 + 0x7c) + 1;
          }
          bVar2 = !bVar2;
        }
        else {
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x48) = *(int *)(lVar1 + 0x7c) + -1;
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x3c) = *(undefined4 *)(lVar1 + 0x7c);
        }
        break;
      case 'P':
        if (*(uint *)(lVar1 + 0x24) < 2) {
          if (local_28 < local_30) {
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x4c) = *(undefined4 *)(lVar1 + 0x50)
            ;
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x50) = *(undefined4 *)(lVar1 + 0x60)
            ;
          }
          else if (local_24 == 0) {
            *(undefined4 *)(lVar1 + 0x88) = *(undefined4 *)(lVar1 + 0x50);
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x4c) = *(undefined4 *)(lVar1 + 0x88)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x50) = *(int *)(lVar1 + 0x88) + 1;
            *(int *)(lVar1 + 0x88) = *(int *)(lVar1 + 0x88) + 1;
          }
          else if (bVar2) {
            bVar2 = *(int *)(lVar1 + 0x88) != *(int *)(lVar1 + 0x60);
            if (bVar2) {
              *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x4c) =
                   *(undefined4 *)(lVar1 + 0x88);
              *(int *)(local_10 + (long)local_20 * 0xf8 + 0x50) = *(int *)(lVar1 + 0x88) + 1;
              *(int *)(lVar1 + 0x88) = *(int *)(lVar1 + 0x88) + 1;
            }
            else {
              *(undefined4 *)(lVar1 + 0x88) = *(undefined4 *)(lVar1 + 0x50);
              *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x4c) =
                   *(undefined4 *)(lVar1 + 0x88);
              *(int *)(local_10 + (long)local_20 * 0xf8 + 0x50) = *(int *)(lVar1 + 0x88) + 1;
              *(int *)(lVar1 + 0x88) = *(int *)(lVar1 + 0x88) + 1;
            }
            bVar2 = !bVar2;
          }
          else {
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x4c) = *(int *)(lVar1 + 0x88) + -1;
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x50) = *(undefined4 *)(lVar1 + 0x88)
            ;
          }
        }
        else if (local_28 < local_30) {
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x68) = *(undefined4 *)(lVar1 + 100);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x70) = *(undefined4 *)(lVar1 + 0x6c);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x6c) = *(undefined4 *)(lVar1 + 0x68);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x74) = *(undefined4 *)(lVar1 + 0x70);
        }
        else if (local_24 == 0) {
          *(undefined4 *)(lVar1 + 0x8c) = *(undefined4 *)(lVar1 + 100);
          *(undefined4 *)(lVar1 + 0x90) = *(undefined4 *)(lVar1 + 0x6c);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x68) = *(undefined4 *)(lVar1 + 0x8c);
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x6c) =
               (*(int *)(lVar1 + 0x8c) + *(int *)(lVar1 + 0x74)) -
               *(int *)(lVar1 + 0x8c) % *(int *)(lVar1 + 0x74);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x70) = *(undefined4 *)(lVar1 + 0x90);
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x74) =
               (*(int *)(lVar1 + 0x90) + *(int *)(lVar1 + 0x78)) -
               *(int *)(lVar1 + 0x90) % *(int *)(lVar1 + 0x78);
          *(undefined4 *)(lVar1 + 0x8c) = *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x6c);
          *(undefined4 *)(lVar1 + 0x90) = *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x74);
        }
        else if (bVar2) {
          if (*(int *)(lVar1 + 0x8c) < *(int *)(lVar1 + 0x68)) {
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x68) = *(undefined4 *)(lVar1 + 0x8c)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x6c) =
                 (*(int *)(lVar1 + 0x8c) + *(int *)(lVar1 + 0x74)) -
                 *(int *)(lVar1 + 0x8c) % *(int *)(lVar1 + 0x74);
            *(undefined4 *)(lVar1 + 0x8c) = *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x6c)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x70) =
                 (*(int *)(lVar1 + 0x90) - *(int *)(lVar1 + 0x78)) -
                 *(int *)(lVar1 + 0x90) % *(int *)(lVar1 + 0x78);
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x74) = *(undefined4 *)(lVar1 + 0x90)
            ;
            bVar2 = false;
          }
          else {
            bVar2 = *(int *)(lVar1 + 0x90) < *(int *)(lVar1 + 0x70);
            if (bVar2) {
              *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x70) =
                   *(undefined4 *)(lVar1 + 0x90);
              *(int *)(local_10 + (long)local_20 * 0xf8 + 0x74) =
                   (*(int *)(lVar1 + 0x90) + *(int *)(lVar1 + 0x78)) -
                   *(int *)(lVar1 + 0x90) % *(int *)(lVar1 + 0x78);
              *(undefined4 *)(lVar1 + 0x90) =
                   *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x74);
            }
            else {
              *(undefined4 *)(lVar1 + 0x90) = *(undefined4 *)(lVar1 + 0x6c);
              *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x70) =
                   *(undefined4 *)(lVar1 + 0x90);
              *(int *)(local_10 + (long)local_20 * 0xf8 + 0x74) =
                   (*(int *)(lVar1 + 0x90) + *(int *)(lVar1 + 0x78)) -
                   *(int *)(lVar1 + 0x90) % *(int *)(lVar1 + 0x78);
              *(undefined4 *)(lVar1 + 0x90) =
                   *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x74);
            }
            bVar2 = !bVar2;
            *(undefined4 *)(lVar1 + 0x8c) = *(undefined4 *)(lVar1 + 100);
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x68) = *(undefined4 *)(lVar1 + 0x8c)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x6c) =
                 (*(int *)(lVar1 + 0x8c) + *(int *)(lVar1 + 0x74)) -
                 *(int *)(lVar1 + 0x8c) % *(int *)(lVar1 + 0x74);
            *(undefined4 *)(lVar1 + 0x8c) = *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x6c)
            ;
          }
        }
        else {
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x68) =
               (*(int *)(lVar1 + 0x8c) - *(int *)(lVar1 + 0x74)) -
               *(int *)(lVar1 + 0x8c) % *(int *)(lVar1 + 0x74);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x6c) = *(undefined4 *)(lVar1 + 0x8c);
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x70) =
               (*(int *)(lVar1 + 0x90) - *(int *)(lVar1 + 0x78)) -
               *(int *)(lVar1 + 0x90) % *(int *)(lVar1 + 0x78);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x74) = *(undefined4 *)(lVar1 + 0x90);
        }
        break;
      case 'R':
        if (local_28 < local_30) {
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x34) = *(undefined4 *)(lVar1 + 0x48);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x40) = *(undefined4 *)(lVar1 + 0x58);
        }
        else if (local_24 == 0) {
          *(undefined4 *)(lVar1 + 0x80) = *(undefined4 *)(lVar1 + 0x48);
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x34) = *(undefined4 *)(lVar1 + 0x80);
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x40) = *(int *)(lVar1 + 0x80) + 1;
          *(int *)(lVar1 + 0x80) = *(int *)(lVar1 + 0x80) + 1;
        }
        else if (bVar2) {
          bVar2 = *(int *)(lVar1 + 0x80) != *(int *)(lVar1 + 0x58);
          if (bVar2) {
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x34) = *(undefined4 *)(lVar1 + 0x80)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x40) = *(int *)(lVar1 + 0x80) + 1;
            *(int *)(lVar1 + 0x80) = *(int *)(lVar1 + 0x80) + 1;
          }
          else {
            *(undefined4 *)(lVar1 + 0x80) = *(undefined4 *)(lVar1 + 0x48);
            *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x34) = *(undefined4 *)(lVar1 + 0x80)
            ;
            *(int *)(local_10 + (long)local_20 * 0xf8 + 0x40) = *(int *)(lVar1 + 0x80) + 1;
            *(int *)(lVar1 + 0x80) = *(int *)(lVar1 + 0x80) + 1;
          }
          bVar2 = !bVar2;
        }
        else {
          *(int *)(local_10 + (long)local_20 * 0xf8 + 0x34) = *(int *)(lVar1 + 0x80) + -1;
          *(undefined4 *)(local_10 + (long)local_20 * 0xf8 + 0x40) = *(undefined4 *)(lVar1 + 0x80);
        }
      }
    }
  }
  return 0;
}

Assistant:

opj_bool pi_create_encode( opj_pi_iterator_t *pi, opj_cp_t *cp,int tileno, int pino,int tpnum, int tppos, J2K_T2_MODE t2_mode,int cur_totnum_tp){
	char prog[4];
	int i;
	int incr_top=1,resetX=0;
	opj_tcp_t *tcps =&cp->tcps[tileno];
	opj_poc_t *tcp= &tcps->pocs[pino];

	pi[pino].first = 1;
	pi[pino].poc.prg = tcp->prg;

	switch(tcp->prg){
		case CPRL: strncpy(prog, "CPRL",4);
			break;
		case LRCP: strncpy(prog, "LRCP",4);
			break;
		case PCRL: strncpy(prog, "PCRL",4);
			break;
		case RLCP: strncpy(prog, "RLCP",4);
			break;
		case RPCL: strncpy(prog, "RPCL",4);
			break;
		case PROG_UNKNOWN: 
			return OPJ_TRUE;
	}

	if(!(cp->tp_on && ((!cp->cinema && (t2_mode == FINAL_PASS)) || cp->cinema))){
		pi[pino].poc.resno0 = tcp->resS;
		pi[pino].poc.resno1 = tcp->resE;
		pi[pino].poc.compno0 = tcp->compS;
		pi[pino].poc.compno1 = tcp->compE;
		pi[pino].poc.layno0 = tcp->layS;
		pi[pino].poc.layno1 = tcp->layE;
		pi[pino].poc.precno0 = tcp->prcS;
		pi[pino].poc.precno1 = tcp->prcE;
		pi[pino].poc.tx0 = tcp->txS;
		pi[pino].poc.ty0 = tcp->tyS;
		pi[pino].poc.tx1 = tcp->txE;
		pi[pino].poc.ty1 = tcp->tyE;
	}else {
		if( tpnum < cur_totnum_tp){
			for(i=3;i>=0;i--){
				switch(prog[i]){
				case 'C':
					if (i > tppos){
						pi[pino].poc.compno0 = tcp->compS;
						pi[pino].poc.compno1 = tcp->compE;
					}else{
						if (tpnum == 0){
							tcp->comp_t = tcp->compS;
							pi[pino].poc.compno0 = tcp->comp_t;
							pi[pino].poc.compno1 = tcp->comp_t+1;
							tcp->comp_t+=1;
						}else{
							if (incr_top == 1){
								if(tcp->comp_t ==tcp->compE){
									tcp->comp_t = tcp->compS;
									pi[pino].poc.compno0 = tcp->comp_t;
									pi[pino].poc.compno1 = tcp->comp_t+1;
									tcp->comp_t+=1;
									incr_top=1;
								}else{
									pi[pino].poc.compno0 = tcp->comp_t;
									pi[pino].poc.compno1 = tcp->comp_t+1;
									tcp->comp_t+=1;
									incr_top=0;
								}
							}else{
								pi[pino].poc.compno0 = tcp->comp_t-1;
								pi[pino].poc.compno1 = tcp->comp_t;
							}
						}
					}
					break;

				case 'R':
					if (i > tppos){
						pi[pino].poc.resno0 = tcp->resS;
						pi[pino].poc.resno1 = tcp->resE;
					}else{
						if (tpnum == 0){
							tcp->res_t = tcp->resS;
							pi[pino].poc.resno0 = tcp->res_t;
							pi[pino].poc.resno1 = tcp->res_t+1;
							tcp->res_t+=1;
						}else{
							if (incr_top == 1){
								if(tcp->res_t==tcp->resE){
									tcp->res_t = tcp->resS;
									pi[pino].poc.resno0 = tcp->res_t;
									pi[pino].poc.resno1 = tcp->res_t+1;
									tcp->res_t+=1;
									incr_top=1;
								}else{
									pi[pino].poc.resno0 = tcp->res_t;
									pi[pino].poc.resno1 = tcp->res_t+1;
									tcp->res_t+=1;
									incr_top=0;
								}
							}else{
								pi[pino].poc.resno0 = tcp->res_t - 1;
								pi[pino].poc.resno1 = tcp->res_t;
							}
						}
					}
					break;

				case 'L':
					if (i > tppos){
						pi[pino].poc.layno0 = tcp->layS;
						pi[pino].poc.layno1 = tcp->layE;
					}else{
						if (tpnum == 0){
							tcp->lay_t = tcp->layS;
							pi[pino].poc.layno0 = tcp->lay_t;
							pi[pino].poc.layno1 = tcp->lay_t+1;
							tcp->lay_t+=1;
						}else{
							if (incr_top == 1){
								if(tcp->lay_t == tcp->layE){
									tcp->lay_t = tcp->layS;
									pi[pino].poc.layno0 = tcp->lay_t;
									pi[pino].poc.layno1 = tcp->lay_t+1;
									tcp->lay_t+=1;
									incr_top=1;
								}else{
									pi[pino].poc.layno0 = tcp->lay_t;
									pi[pino].poc.layno1 = tcp->lay_t+1;
									tcp->lay_t+=1;
									incr_top=0;
								}
							}else{
								pi[pino].poc.layno0 = tcp->lay_t - 1;
								pi[pino].poc.layno1 = tcp->lay_t;
							}
						}
					}
					break;

				case 'P':
					switch(tcp->prg){
						case LRCP:
						case RLCP:
							if (i > tppos){
								pi[pino].poc.precno0 = tcp->prcS;
								pi[pino].poc.precno1 = tcp->prcE;
							}else{
								if (tpnum == 0){
									tcp->prc_t = tcp->prcS;
									pi[pino].poc.precno0 = tcp->prc_t;
									pi[pino].poc.precno1 = tcp->prc_t+1;
									tcp->prc_t+=1; 
								}else{
									if (incr_top == 1){
										if(tcp->prc_t == tcp->prcE){
											tcp->prc_t = tcp->prcS;
											pi[pino].poc.precno0 = tcp->prc_t;
											pi[pino].poc.precno1 = tcp->prc_t+1;
											tcp->prc_t+=1;
											incr_top=1;
										}else{
											pi[pino].poc.precno0 = tcp->prc_t;
											pi[pino].poc.precno1 = tcp->prc_t+1;
											tcp->prc_t+=1;
											incr_top=0;
										}
									}else{
										pi[pino].poc.precno0 = tcp->prc_t - 1;
										pi[pino].poc.precno1 = tcp->prc_t;
									}
								}
							}
						break;
						default:
							if (i > tppos){
								pi[pino].poc.tx0 = tcp->txS;
								pi[pino].poc.ty0 = tcp->tyS;
								pi[pino].poc.tx1 = tcp->txE;
								pi[pino].poc.ty1 = tcp->tyE;
							}else{
								if (tpnum == 0){
									tcp->tx0_t = tcp->txS;
									tcp->ty0_t = tcp->tyS;
									pi[pino].poc.tx0 = tcp->tx0_t;
									pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
									pi[pino].poc.ty0 = tcp->ty0_t;
									pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
									tcp->tx0_t = pi[pino].poc.tx1;
									tcp->ty0_t = pi[pino].poc.ty1;
								}else{
									if (incr_top == 1){
										if(tcp->tx0_t >= tcp->txE){
											if(tcp->ty0_t >= tcp->tyE){
												tcp->ty0_t = tcp->tyS;
												pi[pino].poc.ty0 = tcp->ty0_t;
												pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
												tcp->ty0_t = pi[pino].poc.ty1;
												incr_top=1;resetX=1;
											}else{
												pi[pino].poc.ty0 = tcp->ty0_t;
												pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
												tcp->ty0_t = pi[pino].poc.ty1;
												incr_top=0;resetX=1;
											}
											if(resetX==1){
												tcp->tx0_t = tcp->txS;
												pi[pino].poc.tx0 = tcp->tx0_t;
												pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx- (tcp->tx0_t % tcp->dx);
												tcp->tx0_t = pi[pino].poc.tx1;
											}
										}else{
											pi[pino].poc.tx0 = tcp->tx0_t;
											pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx- (tcp->tx0_t % tcp->dx);
											tcp->tx0_t = pi[pino].poc.tx1;
											pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
											pi[pino].poc.ty1 = tcp->ty0_t ;
											incr_top=0;
										}
									}else{
										pi[pino].poc.tx0 = tcp->tx0_t - tcp->dx - (tcp->tx0_t % tcp->dx);
										pi[pino].poc.tx1 = tcp->tx0_t ;
										pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
										pi[pino].poc.ty1 = tcp->ty0_t ;
									}
								}
							}
						break;
						}
						break;
				}		
			} 
		}
	}	
	return OPJ_FALSE;
}